

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O3

void __thiscall Buffer::prepend(Buffer *this,byte *data,usize size)

{
  byte *pbVar1;
  byte *src;
  Memory *this_00;
  EVP_PKEY_CTX *pEVar2;
  EVP_PKEY_CTX *src_00;
  byte **local_40;
  byte **local_38;
  
  pbVar1 = this->buffer;
  src = this->bufferStart;
  if (pbVar1 == (byte *)0x0) {
    src_00 = (EVP_PKEY_CTX *)(this->bufferEnd + -(long)src);
    pEVar2 = src_00 + size;
  }
  else {
    if (size <= (ulong)((long)src - (long)pbVar1)) {
      this->bufferStart = src + -size;
      Memory::copy((Memory *)(src + -size),(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
      return;
    }
    src_00 = (EVP_PKEY_CTX *)(this->bufferEnd + -(long)src);
    pEVar2 = src_00 + size;
    if (pEVar2 <= (EVP_PKEY_CTX *)this->_capacity) {
      Memory::move(pbVar1 + size,src,(usize)src_00);
      Memory::copy((Memory *)this->buffer,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
      this_00 = (Memory *)this->buffer;
      goto LAB_00107dc8;
    }
  }
  this->_capacity = (usize)pEVar2;
  this_00 = (Memory *)operator_new__((ulong)(pEVar2 + 1));
  Memory::copy(this_00,(EVP_PKEY_CTX *)data,(EVP_PKEY_CTX *)size);
  Memory::copy(this_00 + size,(EVP_PKEY_CTX *)this->bufferStart,src_00);
  if (this->buffer != (byte *)0x0) {
    operator_delete__(this->buffer);
  }
  this->buffer = (byte *)this_00;
LAB_00107dc8:
  local_38 = &this->bufferEnd;
  local_40 = &this->bufferStart;
  *local_40 = (byte *)this_00;
  *local_38 = (byte *)(pEVar2 + (long)this_00);
  return;
}

Assistant:

void prepend(const byte* data, usize size)
  {
    if(buffer && (usize)(bufferStart - buffer) >= size)
    {
      bufferStart -= size;
      Memory::copy(bufferStart, data, size);
      return;
    }
    usize oldSize = bufferEnd - bufferStart;
    usize requiredCapacity = size + oldSize;
    if(buffer && _capacity >= requiredCapacity)
    {
      Memory::move(buffer + size, bufferStart, oldSize);
      Memory::copy(buffer, data, size);
      bufferStart = buffer;
      bufferEnd = buffer + requiredCapacity;
    }
    else
    {
        _capacity = requiredCapacity;
      byte* newBuffer = (byte*)new char[requiredCapacity + 1];
      Memory::copy(newBuffer, data, size);
      Memory::copy(newBuffer + size, bufferStart, oldSize);
      delete [] (char*)buffer;
      bufferStart = buffer = newBuffer;
      bufferEnd = newBuffer+ requiredCapacity;
    }
  }